

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_Guid UA_Guid_random(void)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  UA_Guid UVar5;
  
  uVar1 = pcg32_random_r(&UA_rng);
  uVar2 = pcg32_random_r(&UA_rng);
  uVar3 = pcg32_random_r(&UA_rng);
  uVar4 = pcg32_random_r(&UA_rng);
  UVar5._0_8_ = (ulong)uVar1 | (ulong)(uVar2 & 0xffff) << 0x20 | (ulong)(uVar2 >> 0x10) << 0x30;
  UVar5.data4 = (UA_Byte  [8])
                ((ulong)((uVar3 & 0xff0) << 4) |
                 (ulong)((uVar3 & 0xff00) << 8) |
                 (ulong)((uVar3 & 0xff000) << 0xc) |
                 (ulong)(uVar4 >> 4 & 0xff) << 0x28 |
                 (ulong)(uVar4 >> 8 & 0xff) << 0x30 | (ulong)(uVar4 >> 0xc) << 0x38 |
                 (ulong)(uVar4 & 0xff) << 0x20 | (ulong)(uVar3 & 0xff));
  return UVar5;
}

Assistant:

UA_Guid
UA_Guid_random(void) {
    UA_Guid result;
    result.data1 = (UA_UInt32)pcg32_random_r(&UA_rng);
    UA_UInt32 r = (UA_UInt32)pcg32_random_r(&UA_rng);
    result.data2 = (UA_UInt16) r;
    result.data3 = (UA_UInt16) (r >> 16);
    r = (UA_UInt32)pcg32_random_r(&UA_rng);
    result.data4[0] = (UA_Byte)r;
    result.data4[1] = (UA_Byte)(r >> 4);
    result.data4[2] = (UA_Byte)(r >> 8);
    result.data4[3] = (UA_Byte)(r >> 12);
    r = (UA_UInt32)pcg32_random_r(&UA_rng);
    result.data4[4] = (UA_Byte)r;
    result.data4[5] = (UA_Byte)(r >> 4);
    result.data4[6] = (UA_Byte)(r >> 8);
    result.data4[7] = (UA_Byte)(r >> 12);
    return result;
}